

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculatorTests.cpp
# Opt level: O0

void __thiscall
ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test::TestBody
          (ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test
           *this)

{
  array<float,_16UL> *__return_storage_ptr__;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_2f0;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_15;
  Message local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_14;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_13;
  Message local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_12;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_11;
  Message local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_10;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_9;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_8;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_7;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_90;
  Message local_88 [3];
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  array<float,_16UL> res;
  ImagePositionCalculator imagePositionCalculator;
  ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test *this_local;
  
  res._M_elems[0xe]._3_1_ = 0;
  __return_storage_ptr__ =
       (array<float,_16UL> *)
       ((long)&gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 4);
  unique0x10001b69 = this;
  ImagePositionCalculator::GetCenteredRectangleVertexCoordinates
            (__return_storage_ptr__,(ImagePositionCalculator *)((long)res._M_elems + 0x3b),1000,1000
             ,500,500);
  pvVar2 = std::array<float,_16UL>::operator[](__return_storage_ptr__,0);
  local_6c = 0xfa;
  testing::internal::EqHelper::Compare<float,_int,_nullptr>
            ((EqHelper *)local_68,"res[0]","250",pvVar2,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar2 = std::array<float,_16UL>::operator[]
                       ((array<float,_16UL> *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4),1);
    local_ac = 0xfa;
    testing::internal::EqHelper::Compare<float,_int,_nullptr>
              ((EqHelper *)local_a8,"res[1]","250",pvVar2,&local_ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                 ,0x28,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pvVar2 = std::array<float,_16UL>::operator[]
                         ((array<float,_16UL> *)
                          ((long)&gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 4),2);
      local_d4 = 0;
      testing::internal::EqHelper::Compare<float,_int,_nullptr>
                ((EqHelper *)local_d0,"res[2]","0",pvVar2,&local_d4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                   ,0x29,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pvVar2 = std::array<float,_16UL>::operator[]
                           ((array<float,_16UL> *)
                            ((long)&gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            + 4),3);
        local_fc = 0;
        testing::internal::EqHelper::Compare<float,_int,_nullptr>
                  ((EqHelper *)local_f8,"res[3]","0",pvVar2,&local_fc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_108);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                     ,0x2a,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_108);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_108);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pvVar2 = std::array<float,_16UL>::operator[]
                             ((array<float,_16UL> *)
                              ((long)&gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              + 4),4);
          local_124 = 0x2ee;
          testing::internal::EqHelper::Compare<float,_int,_nullptr>
                    ((EqHelper *)local_120,"res[4]","750",pvVar2,&local_124);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
          if (!bVar1) {
            testing::Message::Message(&local_130);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                       ,0x2c,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_130);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_130);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pvVar2 = std::array<float,_16UL>::operator[]
                               ((array<float,_16UL> *)
                                ((long)&gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),5);
            local_14c = 0xfa;
            testing::internal::EqHelper::Compare<float,_int,_nullptr>
                      ((EqHelper *)local_148,"res[5]","250",pvVar2,&local_14c);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
            if (!bVar1) {
              testing::Message::Message(&local_158);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                         ,0x2d,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_158);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_158);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pvVar2 = std::array<float,_16UL>::operator[]
                                 ((array<float,_16UL> *)
                                  ((long)&gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  + 4),6);
              local_174 = 1;
              testing::internal::EqHelper::Compare<float,_int,_nullptr>
                        ((EqHelper *)local_170,"res[6]","1",pvVar2,&local_174);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
              if (!bVar1) {
                testing::Message::Message(&local_180);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                           ,0x2e,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_180);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_180);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pvVar2 = std::array<float,_16UL>::operator[]
                                   ((array<float,_16UL> *)
                                    ((long)&gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 4),7);
                local_19c = 0;
                testing::internal::EqHelper::Compare<float,_int,_nullptr>
                          ((EqHelper *)local_198,"res[7]","0",pvVar2,&local_19c);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_198);
                if (!bVar1) {
                  testing::Message::Message(&local_1a8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                             ,0x2f,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_1a8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_1a8);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pvVar2 = std::array<float,_16UL>::operator[]
                                     ((array<float,_16UL> *)
                                      ((long)&gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      + 4),8);
                  local_1c4 = 0x2ee;
                  testing::internal::EqHelper::Compare<float,_int,_nullptr>
                            ((EqHelper *)local_1c0,"res[8]","750",pvVar2,&local_1c4);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_1c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_1d0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                               ,0x31,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_1d0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_1d0);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pvVar2 = std::array<float,_16UL>::operator[]
                                       ((array<float,_16UL> *)
                                        ((long)&gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 4),9);
                    local_1ec = 0x2ee;
                    testing::internal::EqHelper::Compare<float,_int,_nullptr>
                              ((EqHelper *)local_1e8,"res[9]","750",pvVar2,&local_1ec);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_1f8);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1e8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                 ,0x32,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_1f8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_1f8);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pvVar2 = std::array<float,_16UL>::operator[]
                                         ((array<float,_16UL> *)
                                          ((long)&gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          + 4),10);
                      local_214 = 1;
                      testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                ((EqHelper *)local_210,"res[10]","1",pvVar2,&local_214);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_210);
                      if (!bVar1) {
                        testing::Message::Message(&local_220);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_210);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                   ,0x33,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_220);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_220);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pvVar2 = std::array<float,_16UL>::operator[]
                                           ((array<float,_16UL> *)
                                            ((long)&gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            + 4),0xb);
                        local_23c = 1;
                        testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                  ((EqHelper *)local_238,"res[11]","1",pvVar2,&local_23c);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_238);
                        if (!bVar1) {
                          testing::Message::Message(&local_248);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_238);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                     ,0x34,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_248);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_248);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pvVar2 = std::array<float,_16UL>::operator[]
                                             ((array<float,_16UL> *)
                                              ((long)&gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              + 4),0xc);
                          local_264 = 0xfa;
                          testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                    ((EqHelper *)local_260,"res[12]","250",pvVar2,&local_264);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_260);
                          if (!bVar1) {
                            testing::Message::Message(&local_270);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_260);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                       ,0x36,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_270);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_270);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            pvVar2 = std::array<float,_16UL>::operator[]
                                               ((array<float,_16UL> *)
                                                ((long)&gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                + 4),0xd);
                            local_28c = 0x2ee;
                            testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                      ((EqHelper *)local_288,"res[13]","750",pvVar2,&local_28c);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_288);
                            if (!bVar1) {
                              testing::Message::Message(&local_298);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_288);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                         ,0x37,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_298);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_298);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_288)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pvVar2 = std::array<float,_16UL>::operator[]
                                                 ((array<float,_16UL> *)
                                                  ((long)&gtest_ar.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),0xe);
                              local_2b4 = 0;
                              testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                        ((EqHelper *)local_2b0,"res[14]","0",pvVar2,&local_2b4);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2b0);
                              if (!bVar1) {
                                testing::Message::Message(&local_2c0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2b0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                           ,0x38,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_2c0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_2c0);
                              }
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2b0);
                              if (gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pvVar2 = std::array<float,_16UL>::operator[]
                                                   ((array<float,_16UL> *)
                                                    ((long)&gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),0xf);
                                local_2dc = 1;
                                testing::internal::EqHelper::Compare<float,_int,_nullptr>
                                          ((EqHelper *)local_2d8,"res[15]","1",pvVar2,&local_2dc);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_2d8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_2e8);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_2d8);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_2f0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ImagePositionCalculatorTests.cpp"
                                             ,0x39,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                                  testing::Message::~Message(&local_2e8);
                                }
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_2d8);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(ImagePositionCalculator, ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly)
{
    ImagePositionCalculator imagePositionCalculator{};

    auto res = imagePositionCalculator.GetCenteredRectangleVertexCoordinates(1000, 1000, 500, 500);
    ASSERT_EQ(res[0], 250);
    ASSERT_EQ(res[1], 250);
    ASSERT_EQ(res[2], 0);
    ASSERT_EQ(res[3], 0);

    ASSERT_EQ(res[4], 750);
    ASSERT_EQ(res[5], 250);
    ASSERT_EQ(res[6], 1);
    ASSERT_EQ(res[7], 0);

    ASSERT_EQ(res[8], 750);
    ASSERT_EQ(res[9], 750);
    ASSERT_EQ(res[10], 1);
    ASSERT_EQ(res[11], 1);

    ASSERT_EQ(res[12], 250);
    ASSERT_EQ(res[13], 750);
    ASSERT_EQ(res[14], 0);
    ASSERT_EQ(res[15], 1);
}